

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O0

HelicsPublication
helicsFederateRegisterPublication
          (HelicsFederate fed,char *key,HelicsDataTypes type,char *units,HelicsError *err)

{
  string_view type_00;
  string_view name;
  string_view units_00;
  bool bVar1;
  Publication *pPVar2;
  pointer pPVar3;
  HelicsFederate in_RCX;
  int in_EDX;
  DataType type_01;
  long in_RSI;
  unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_> *in_RDI;
  HelicsError *in_R8;
  __sv_type _Var4;
  __single_object pub;
  shared_ptr<helics::ValueFederate> fedObj;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  shared_ptr<helics::ValueFederate> *this;
  char *in_stack_ffffffffffffff28;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff30;
  HelicsFederate in_stack_ffffffffffffff38;
  shared_ptr<helics::ValueFederate> *local_90;
  shared_ptr<helics::ValueFederate> *pub_00;
  HelicsFederate fed_00;
  undefined1 in_stack_ffffffffffffff90 [16];
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  ValueFederate *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffe0;
  char *in_stack_fffffffffffffff8;
  HelicsPublication pvVar5;
  
  type_01 = in_stack_ffffffffffffff90._12_4_;
  getValueFedSharedPtr(in_stack_ffffffffffffff38,(HelicsError *)in_stack_ffffffffffffff30);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&stack0xffffffffffffffc0);
  if (!bVar1) {
    pvVar5 = (HelicsPublication)0x0;
    goto LAB_001cbf30;
  }
  if ((in_EDX < 0) || (9 < in_EDX)) {
    if (in_EDX == 0x19) {
      pvVar5 = helicsFederateRegisterTypePublication
                         (in_RCX,(char *)in_R8,in_stack_ffffffffffffffc8,
                          (char *)in_stack_ffffffffffffffc0,
                          (HelicsError *)
                          CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      goto LAB_001cbf30;
    }
    if (in_EDX != 0x1e) {
      assignError(in_R8,-4,"unrecognized type code");
      pvVar5 = (HelicsPublication)0x0;
      goto LAB_001cbf30;
    }
  }
  std::make_unique<helics::PublicationObject>();
  std::__shared_ptr_access<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
             )0x1cbd2f);
  if (in_RSI == 0) {
    _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff20);
    type_01 = _Var4._M_str._4_4_;
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  }
  helics::typeNameStringRef_abi_cxx11_(type_01);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff20);
  fed_00 = (HelicsFederate)_Var4._M_len;
  if (in_RCX == (HelicsFederate)0x0) {
    _local_90 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff20);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  }
  name._M_str._0_4_ = in_stack_ffffffffffffffe0;
  name._M_len = (size_t)in_RCX;
  name._M_str._4_4_ = in_EDX;
  type_00._M_str = (char *)in_R8;
  type_00._M_len = (size_t)in_stack_ffffffffffffffc8;
  units_00._M_str = in_stack_fffffffffffffff8;
  units_00._M_len = (size_t)in_RDI;
  this = pub_00;
  pPVar2 = helics::ValueFederate::registerPublication
                     (in_stack_ffffffffffffffc0,name,type_00,units_00);
  pPVar3 = std::
           unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>::
           operator->((unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>
                       *)0x1cbe0d);
  pPVar3->pubPtr = pPVar2;
  std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>::
  operator->((unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>
              *)0x1cbe20);
  std::shared_ptr<helics::ValueFederate>::operator=(this,local_90);
  std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>::
  unique_ptr((unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>
              *)this,(unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>
                      *)local_90);
  pvVar5 = anon_unknown.dwarf_5d1c2::addPublication
                     (fed_00,(unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>
                              *)pub_00);
  std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>::
  ~unique_ptr(in_RDI);
  std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>::
  ~unique_ptr(in_RDI);
LAB_001cbf30:
  std::shared_ptr<helics::ValueFederate>::~shared_ptr((shared_ptr<helics::ValueFederate> *)0x1cbf3d)
  ;
  return pvVar5;
}

Assistant:

HelicsPublication
    helicsFederateRegisterPublication(HelicsFederate fed, const char* key, HelicsDataTypes type, const char* units, HelicsError* err)
{
    auto fedObj = getValueFedSharedPtr(fed, err);
    if (!fedObj) {
        return nullptr;
    }
    if ((type < HELICS_DATA_TYPE_STRING) || (type > HELICS_DATA_TYPE_CHAR)) {
        if (type == HELICS_DATA_TYPE_RAW) {
            return helicsFederateRegisterTypePublication(fed, key, "raw", units, err);
        }
        if (type != HELICS_DATA_TYPE_JSON) {
            assignError(err, HELICS_ERROR_INVALID_ARGUMENT, unknownTypeCode);
            return nullptr;
        }
    }
    try {
        auto pub = std::make_unique<helics::PublicationObject>();
        pub->pubPtr = &(fedObj->registerPublication(AS_STRING_VIEW(key),
                                                    helics::typeNameStringRef(static_cast<helics::DataType>(type)),
                                                    AS_STRING_VIEW(units)));
        pub->fedptr = std::move(fedObj);
        return addPublication(fed, std::move(pub));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
    return nullptr;
}